

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

PtrTokenOrSyntax * __thiscall
slang::syntax::CoverCrossSyntax::getChildPtr(CoverCrossSyntax *this,size_t index)

{
  undefined8 in_RSI;
  long in_RDI;
  SyntaxNode *in_stack_ffffffffffffff98;
  PtrTokenOrSyntax *in_stack_ffffffffffffffa0;
  PtrTokenOrSyntax *local_10;
  
  switch(in_RSI) {
  case 0:
    PtrTokenOrSyntax::PtrTokenOrSyntax(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    break;
  case 1:
    PtrTokenOrSyntax::PtrTokenOrSyntax(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    break;
  case 2:
    PtrTokenOrSyntax::PtrTokenOrSyntax(in_stack_ffffffffffffffa0,(Token *)in_stack_ffffffffffffff98)
    ;
    break;
  case 3:
    PtrTokenOrSyntax::PtrTokenOrSyntax(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    break;
  case 4:
    PtrTokenOrSyntax::PtrTokenOrSyntax(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    break;
  case 5:
    PtrTokenOrSyntax::PtrTokenOrSyntax(in_stack_ffffffffffffffa0,(Token *)in_stack_ffffffffffffff98)
    ;
    break;
  case 6:
    PtrTokenOrSyntax::PtrTokenOrSyntax
              ((PtrTokenOrSyntax *)(in_RDI + 0xb8),in_stack_ffffffffffffff98);
    break;
  case 7:
    PtrTokenOrSyntax::PtrTokenOrSyntax(in_stack_ffffffffffffffa0,(Token *)in_stack_ffffffffffffff98)
    ;
    break;
  case 8:
    PtrTokenOrSyntax::PtrTokenOrSyntax(in_stack_ffffffffffffffa0,(Token *)in_stack_ffffffffffffff98)
    ;
    break;
  default:
    PtrTokenOrSyntax::PtrTokenOrSyntax(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  }
  return local_10;
}

Assistant:

PtrTokenOrSyntax CoverCrossSyntax::getChildPtr(size_t index) {
    switch (index) {
        case 0: return &attributes;
        case 1: return label;
        case 2: return &cross;
        case 3: return &items;
        case 4: return iff;
        case 5: return &openBrace;
        case 6: return &members;
        case 7: return &closeBrace;
        case 8: return &emptySemi;
        default: return nullptr;
    }
}